

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.cpp
# Opt level: O2

int __thiscall CVmObjCharSet::equals(CVmObjCharSet *this,vm_obj_id_t self,vm_val_t *val,int param_3)

{
  char *pcVar1;
  long lVar2;
  size_t len;
  int iVar3;
  uint uVar4;
  
  uVar4 = 0;
  if (val->typ == VM_OBJ) {
    if ((val->val).obj == self) {
      uVar4 = 1;
    }
    else {
      iVar3 = is_charset((val->val).obj);
      uVar4 = 0;
      if (iVar3 != 0) {
        pcVar1 = (this->super_CVmObject).ext_;
        lVar2 = *(long *)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][(val->val).obj & 0xfff]
                                 .ptr_ + 8);
        len = *(size_t *)(pcVar1 + 0x10);
        if (len == *(size_t *)(lVar2 + 0x10)) {
          iVar3 = memicmp(pcVar1 + 0x18,(void *)(lVar2 + 0x18),len);
          uVar4 = (uint)(iVar3 == 0);
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int CVmObjCharSet::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                          int /*depth*/) const
{
    CVmObjCharSet *other;
    const vmobj_charset_ext_t *ext;
    const vmobj_charset_ext_t *other_ext;

    /* if it's a self-reference, it's certainly equal */
    if (val->typ == VM_OBJ && val->val.obj == self)
        return TRUE;

    /* if it's not another character set, it's not equal */
    if (val->typ != VM_OBJ || !is_charset(vmg_ val->val.obj))
        return FALSE;

    /* we know it's another character set - cast it */
    other = (CVmObjCharSet *)vm_objp(vmg_ val->val.obj);

    /* get my extension and the other extension */
    ext = get_ext_ptr();
    other_ext = other->get_ext_ptr();

    /* it's equal if it has the same name (ignoring case) */
    return (ext->charset_name_len == other_ext->charset_name_len
            && memicmp(ext->charset_name, other_ext->charset_name,
                       ext->charset_name_len) == 0);
}